

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

_Bool __thiscall ImFont::IsGlyphRangeUnused(ImFont *this,uint c_begin,uint c_last)

{
  uint uVar1;
  uint uVar2;
  _Bool _Var3;
  
  uVar2 = c_begin >> 0xc;
  uVar1 = c_last >> 0xc;
  _Var3 = true;
  if (uVar2 <= uVar1) {
    _Var3 = false;
    do {
      if ((uVar2 < 0x10) && ((this->Used4kPagesMap[uVar2 >> 3] >> (uVar2 & 7) & 1) != 0)) {
        return _Var3;
      }
      _Var3 = uVar1 <= uVar2;
      uVar2 = uVar2 + 1;
    } while (uVar1 + 1 != uVar2);
  }
  return _Var3;
}

Assistant:

bool ImFont::IsGlyphRangeUnused(unsigned int c_begin, unsigned int c_last)
{
    unsigned int page_begin = (c_begin / 4096);
    unsigned int page_last = (c_last / 4096);
    for (unsigned int page_n = page_begin; page_n <= page_last; page_n++)
        if ((page_n >> 3) < sizeof(Used4kPagesMap))
            if (Used4kPagesMap[page_n >> 3] & (1 << (page_n & 7)))
                return false;
    return true;
}